

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.h
# Opt level: O0

char * leveldb::GetVarint32Ptr(char *p,char *limit,uint32_t *value)

{
  uint32_t *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  uint32_t result;
  byte *local_8;
  
  if ((in_RDI < in_RSI) && ((*in_RDI & 0x80) == 0)) {
    *in_RDX = (uint)*in_RDI;
    local_8 = in_RDI + 1;
  }
  else {
    local_8 = (byte *)GetVarint32PtrFallback((char *)in_RDI,(char *)in_RSI,in_RDX);
  }
  return (char *)local_8;
}

Assistant:

inline const char* GetVarint32Ptr(const char* p, const char* limit,
                                  uint32_t* value) {
  if (p < limit) {
    uint32_t result = *(reinterpret_cast<const uint8_t*>(p));
    if ((result & 128) == 0) {
      *value = result;
      return p + 1;
    }
  }
  return GetVarint32PtrFallback(p, limit, value);
}